

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O2

void __thiscall
GrcErrorList::SetFileNameFromGdlFile(GrcErrorList *this,GrcManager *pcman,char *pchGdlFile)

{
  int iVar1;
  size_t sVar2;
  string strErrFileName;
  
  std::__cxx11::string::string((string *)&strErrFileName,(string *)&pcman->m_staErrorFileName);
  iVar1 = std::__cxx11::string::find((char)&strErrFileName,0x5c);
  if (iVar1 == -1) {
    iVar1 = std::__cxx11::string::find((char)&strErrFileName,0x2f);
    if (iVar1 == -1) {
      for (sVar2 = strlen(pchGdlFile); (pchGdlFile[sVar2] != '/' && (pchGdlFile[sVar2] != '\\'));
          sVar2 = sVar2 - 1) {
        if (pchGdlFile + sVar2 <= pchGdlFile) {
          std::__cxx11::string::_M_assign((string *)&this->m_strErrFile);
          goto LAB_00147610;
        }
      }
      std::__cxx11::string::assign((char *)&this->m_strErrFile,(ulong)pchGdlFile);
      std::__cxx11::string::append((string *)&this->m_strErrFile);
      goto LAB_00147610;
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->m_strErrFile);
LAB_00147610:
  std::__cxx11::string::~string((string *)&strErrFileName);
  return;
}

Assistant:

void GrcErrorList::SetFileNameFromGdlFile(GrcManager * pcman, char * pchGdlFile)
{
	std::string strErrFileName = pcman->ErrorFileName();
	int pos = (int)strErrFileName.find('\\');
	if (pos == -1)
		pos = (int)strErrFileName.find('/');
	if (pos != -1)
	{
		// path is indicated in the specified filename; don't change it
		m_strErrFile = strErrFileName;
		return;
	}

	char * pchEnd = pchGdlFile + strlen(pchGdlFile);
	while (*pchEnd != '\\' && *pchEnd != '/')
	{
		if (pchEnd <= pchGdlFile)
		{
			m_strErrFile = strErrFileName;  // GDL file has no path specified
			return;
		}
		pchEnd--;
	}
	m_strErrFile.assign(pchGdlFile, (pchEnd - pchGdlFile + 1));
	m_strErrFile.append(strErrFileName);
}